

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::sse2::DiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  byte bVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  undefined4 uVar22;
  ulong uVar23;
  RTCFilterFunctionN p_Var24;
  RayHitK<4> *pRVar25;
  long lVar26;
  Scene *pSVar27;
  long lVar28;
  float fVar29;
  float fVar35;
  float fVar37;
  float fVar39;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar36;
  uint uVar38;
  uint uVar40;
  undefined1 auVar34 [16];
  float fVar41;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_1b8 [16];
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  RayQueryContext *local_198;
  Scene *local_190;
  RTCFilterFunctionNArguments local_188;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118 [4];
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [4];
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar27 = context->scene;
  local_d8[0] = Disc->sharedGeomID;
  pGVar9 = (pSVar27->geometries).items[local_d8[0]].ptr;
  lVar26 = *(long *)&pGVar9->field_0x58;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar26 + (Disc->primIDs).field_0.i[0] * _Var10);
  pfVar2 = (float *)(lVar26 + (Disc->primIDs).field_0.i[1] * _Var10);
  pfVar3 = (float *)(lVar26 + (Disc->primIDs).field_0.i[2] * _Var10);
  pfVar4 = (float *)(lVar26 + (Disc->primIDs).field_0.i[3] * _Var10);
  bVar8 = Disc->numPrimitives;
  local_d8[1] = local_d8[0];
  local_d8[2] = local_d8[0];
  local_d8[3] = local_d8[0];
  fVar57 = *(float *)(ray + k * 4);
  fVar51 = *(float *)(ray + k * 4 + 0x10);
  fVar62 = *(float *)(ray + k * 4 + 0x20);
  fVar29 = *(float *)(ray + k * 4 + 0x30);
  fVar52 = *pfVar1 - fVar57;
  fVar55 = *pfVar2 - fVar57;
  fVar56 = *pfVar3 - fVar57;
  fVar57 = *pfVar4 - fVar57;
  fVar41 = pfVar1[1] - fVar51;
  fVar49 = pfVar2[1] - fVar51;
  fVar50 = pfVar3[1] - fVar51;
  fVar51 = pfVar4[1] - fVar51;
  fVar58 = pfVar1[2] - fVar62;
  fVar60 = pfVar2[2] - fVar62;
  fVar61 = pfVar3[2] - fVar62;
  fVar62 = pfVar4[2] - fVar62;
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  fVar6 = *(float *)(ray + k * 4 + 0x50);
  fVar7 = *(float *)(ray + k * 4 + 0x60);
  fVar76 = fVar6 * fVar6 + fVar7 * fVar7;
  fVar75 = fVar5 * fVar5 + fVar76;
  auVar77._4_4_ = fVar75;
  auVar77._0_4_ = fVar75;
  auVar77._8_4_ = fVar75;
  auVar77._12_4_ = fVar75;
  auVar77 = rcpps(ZEXT416((uint)fVar76),auVar77);
  fVar76 = auVar77._0_4_;
  fVar81 = auVar77._4_4_;
  fVar82 = auVar77._8_4_;
  fVar83 = auVar77._12_4_;
  fVar76 = (fVar52 * fVar5 + fVar41 * fVar6 + fVar58 * fVar7) *
           ((1.0 - fVar75 * fVar76) * fVar76 + fVar76);
  fVar81 = (fVar55 * fVar5 + fVar49 * fVar6 + fVar60 * fVar7) *
           ((1.0 - fVar75 * fVar81) * fVar81 + fVar81);
  fVar82 = (fVar56 * fVar5 + fVar50 * fVar6 + fVar61 * fVar7) *
           ((1.0 - fVar75 * fVar82) * fVar82 + fVar82);
  fVar83 = (fVar57 * fVar5 + fVar51 * fVar6 + fVar62 * fVar7) *
           ((1.0 - fVar75 * fVar83) * fVar83 + fVar83);
  fVar75 = *(float *)(ray + k * 4 + 0x80);
  uVar78 = 0;
  uVar79 = 0;
  uVar80 = 0;
  bVar16 = (fVar76 <= fVar75 && fVar29 <= fVar76) && bVar8 != 0;
  bVar17 = (fVar81 <= fVar75 && fVar29 <= fVar81) && 1 < bVar8;
  bVar18 = (fVar82 <= fVar75 && fVar29 <= fVar82) && 2 < bVar8;
  bVar19 = (fVar83 <= fVar75 && fVar29 <= fVar83) && 3 < bVar8;
  auVar15._4_4_ = -(uint)bVar17;
  auVar15._0_4_ = -(uint)bVar16;
  auVar15._8_4_ = -(uint)bVar18;
  auVar15._12_4_ = -(uint)bVar19;
  iVar20 = movmskps(local_d8[0],auVar15);
  if (iVar20 != 0) {
    fVar63 = fVar52 - fVar5 * fVar76;
    fVar64 = fVar55 - fVar5 * fVar81;
    fVar65 = fVar56 - fVar5 * fVar82;
    fVar66 = fVar57 - fVar5 * fVar83;
    fVar67 = fVar41 - fVar6 * fVar76;
    fVar68 = fVar49 - fVar6 * fVar81;
    fVar69 = fVar50 - fVar6 * fVar82;
    fVar70 = fVar51 - fVar6 * fVar83;
    fVar71 = fVar58 - fVar7 * fVar76;
    fVar72 = fVar60 - fVar7 * fVar81;
    fVar73 = fVar61 - fVar7 * fVar82;
    fVar74 = fVar62 - fVar7 * fVar83;
    fVar29 = pfVar1[3] * pfVar1[3];
    fVar35 = pfVar2[3] * pfVar2[3];
    fVar37 = pfVar3[3] * pfVar3[3];
    fVar39 = pfVar4[3] * pfVar4[3];
    bVar16 = fVar63 * fVar63 + fVar67 * fVar67 + fVar71 * fVar71 <= fVar29 && bVar16;
    bVar17 = fVar64 * fVar64 + fVar68 * fVar68 + fVar72 * fVar72 <= fVar35 && bVar17;
    bVar18 = fVar65 * fVar65 + fVar69 * fVar69 + fVar73 * fVar73 <= fVar37 && bVar18;
    bVar19 = fVar66 * fVar66 + fVar70 * fVar70 + fVar74 * fVar74 <= fVar39 && bVar19;
    auVar11._4_4_ = -(uint)bVar17;
    auVar11._0_4_ = -(uint)bVar16;
    auVar11._8_4_ = -(uint)bVar18;
    auVar11._12_4_ = -(uint)bVar19;
    iVar20 = movmskps(iVar20,auVar11);
    if (iVar20 != 0) {
      bVar16 = fVar29 < fVar52 * fVar52 + fVar41 * fVar41 + fVar58 * fVar58 && bVar16;
      local_1b8._0_4_ = -(uint)bVar16;
      bVar17 = fVar35 < fVar55 * fVar55 + fVar49 * fVar49 + fVar60 * fVar60 && bVar17;
      local_1b8._4_4_ = -(uint)bVar17;
      bVar18 = fVar37 < fVar56 * fVar56 + fVar50 * fVar50 + fVar61 * fVar61 && bVar18;
      local_1b8._8_4_ = -(uint)bVar18;
      bVar19 = fVar39 < fVar57 * fVar57 + fVar51 * fVar51 + fVar62 * fVar62 && bVar19;
      local_1b8._12_4_ = -(uint)bVar19;
      auVar12._4_4_ = local_1b8._4_4_;
      auVar12._0_4_ = local_1b8._0_4_;
      auVar12._8_4_ = local_1b8._8_4_;
      auVar12._12_4_ = local_1b8._12_4_;
      iVar20 = movmskps(iVar20,auVar12);
      if (iVar20 != 0) {
        local_128 = 0;
        uStack_120 = 0;
        local_138 = 0;
        uStack_130 = 0;
        local_118[0] = fVar76;
        local_118[1] = fVar81;
        local_118[2] = fVar82;
        local_118[3] = fVar83;
        local_108[0] = -fVar5;
        local_108[1] = -fVar5;
        local_108[2] = -fVar5;
        local_108[3] = -fVar5;
        local_f8[0] = -fVar6;
        local_f8[1] = -fVar6;
        local_f8[2] = -fVar6;
        local_f8[3] = -fVar6;
        local_e8[0] = -fVar7;
        local_e8[1] = -fVar7;
        local_e8[2] = -fVar7;
        local_e8[3] = -fVar7;
        auVar30._0_4_ = (uint)fVar76 & local_1b8._0_4_;
        auVar30._4_4_ = (uint)fVar81 & local_1b8._4_4_;
        auVar30._8_4_ = (uint)fVar82 & local_1b8._8_4_;
        auVar30._12_4_ = (uint)fVar83 & local_1b8._12_4_;
        auVar42._0_8_ = CONCAT44(~local_1b8._4_4_,~local_1b8._0_4_) & 0x7f8000007f800000;
        auVar42._8_4_ = ~local_1b8._8_4_ & 0x7f800000;
        auVar42._12_4_ = ~local_1b8._12_4_ & 0x7f800000;
        auVar42 = auVar42 | auVar30;
        auVar53._4_4_ = auVar42._0_4_;
        auVar53._0_4_ = auVar42._4_4_;
        auVar53._8_4_ = auVar42._12_4_;
        auVar53._12_4_ = auVar42._8_4_;
        auVar77 = minps(auVar53,auVar42);
        auVar31._0_8_ = auVar77._8_8_;
        auVar31._8_4_ = auVar77._0_4_;
        auVar31._12_4_ = auVar77._4_4_;
        auVar77 = minps(auVar31,auVar77);
        auVar32._0_4_ = -(uint)(auVar77._0_4_ == auVar42._0_4_ && bVar16);
        auVar32._4_4_ = -(uint)(auVar77._4_4_ == auVar42._4_4_ && bVar17);
        auVar32._8_4_ = -(uint)(auVar77._8_4_ == auVar42._8_4_ && bVar18);
        auVar32._12_4_ = -(uint)(auVar77._12_4_ == auVar42._12_4_ && bVar19);
        iVar20 = movmskps(iVar20,auVar32);
        uVar21 = local_1b8._0_4_;
        uVar36 = local_1b8._4_4_;
        uVar38 = local_1b8._8_4_;
        uVar40 = local_1b8._12_4_;
        if (iVar20 != 0) {
          uVar21 = auVar32._0_4_;
          uVar36 = auVar32._4_4_;
          uVar38 = auVar32._8_4_;
          uVar40 = auVar32._12_4_;
        }
        auVar13._4_4_ = uVar36;
        auVar13._0_4_ = uVar21;
        auVar13._8_4_ = uVar38;
        auVar13._12_4_ = uVar40;
        uVar21 = movmskps(iVar20,auVar13);
        lVar26 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
        lVar28 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
        do {
          local_188.hit = (RTCHitN *)&local_c8;
          local_188.valid = &local_1a8;
          local_68 = local_d8[lVar26];
          uVar23 = (ulong)local_68;
          pGVar9 = (pSVar27->geometries).items[uVar23].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1b8 + lVar26 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar78 = *(undefined4 *)((long)&local_138 + lVar26 * 4);
              uVar79 = *(undefined4 *)((long)&local_128 + lVar26 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_118[lVar26];
              *(float *)(ray + k * 4 + 0xc0) = local_108[lVar26];
              *(float *)(ray + k * 4 + 0xd0) = local_f8[lVar26];
              *(float *)(ray + k * 4 + 0xe0) = local_e8[lVar26];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar78;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar79;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar26];
              *(uint *)(ray + k * 4 + 0x120) = local_68;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_98 = *(undefined4 *)((long)&local_138 + lVar26 * 4);
            local_88 = *(undefined4 *)((long)&local_128 + lVar26 * 4);
            local_c8 = local_108[lVar26];
            local_b8 = local_f8[lVar26];
            local_78 = (Disc->primIDs).field_0.i[lVar26];
            local_a8 = local_e8[lVar26];
            fStack_c4 = local_c8;
            fStack_c0 = local_c8;
            fStack_bc = local_c8;
            fStack_b4 = local_b8;
            fStack_b0 = local_b8;
            fStack_ac = local_b8;
            fStack_a4 = local_a8;
            fStack_a0 = local_a8;
            fStack_9c = local_a8;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_84 = local_88;
            uStack_80 = local_88;
            uStack_7c = local_88;
            uStack_74 = local_78;
            uStack_70 = local_78;
            uStack_6c = local_78;
            uStack_64 = local_68;
            uStack_60 = local_68;
            uStack_5c = local_68;
            local_58 = context->user->instID[0];
            uStack_54 = local_58;
            uStack_50 = local_58;
            uStack_4c = local_58;
            local_48 = context->user->instPrimID[0];
            uStack_44 = local_48;
            uStack_40 = local_48;
            uStack_3c = local_48;
            *(float *)(ray + k * 4 + 0x80) = local_118[lVar26];
            local_1a8 = *(int *)(mm_lookupmask_ps + lVar28);
            iStack_1a4 = *(int *)(mm_lookupmask_ps + lVar28 + 4);
            iStack_1a0 = *(int *)(mm_lookupmask_ps + lVar28 + 8);
            iStack_19c = *(int *)(mm_lookupmask_ps + lVar28 + 0xc);
            local_188.geometryUserPtr = pGVar9->userPtr;
            local_188.context = context->user;
            local_188.N = 4;
            p_Var24 = pGVar9->intersectionFilterN;
            local_198 = context;
            local_188.ray = (RTCRayN *)ray;
            local_158 = fVar75;
            uStack_154 = uVar78;
            uStack_150 = uVar79;
            uStack_14c = uVar80;
            local_148 = fVar76;
            fStack_144 = fVar81;
            fStack_140 = fVar82;
            fStack_13c = fVar83;
            if (p_Var24 != (RTCFilterFunctionN)0x0) {
              local_190 = pSVar27;
              p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_188);
              pSVar27 = local_190;
            }
            auVar43._0_4_ = -(uint)(local_1a8 == 0);
            auVar43._4_4_ = -(uint)(iStack_1a4 == 0);
            auVar43._8_4_ = -(uint)(iStack_1a0 == 0);
            auVar43._12_4_ = -(uint)(iStack_19c == 0);
            uVar21 = movmskps((int)p_Var24,auVar43);
            pRVar25 = (RayHitK<4> *)(ulong)(uVar21 ^ 0xf);
            if ((uVar21 ^ 0xf) == 0) {
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar44 = auVar43 ^ auVar14;
              context = local_198;
              fVar76 = local_148;
              fVar81 = fStack_144;
              fVar82 = fStack_140;
              fVar83 = fStack_13c;
            }
            else {
              p_Var24 = local_198->args->filter;
              if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                 (((local_198->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_188);
              }
              auVar33._0_4_ = -(uint)(local_1a8 == 0);
              auVar33._4_4_ = -(uint)(iStack_1a4 == 0);
              auVar33._8_4_ = -(uint)(iStack_1a0 == 0);
              auVar33._12_4_ = -(uint)(iStack_19c == 0);
              auVar44._8_4_ = 0xffffffff;
              auVar44._0_8_ = 0xffffffffffffffff;
              auVar44._12_4_ = 0xffffffff;
              auVar44 = auVar33 ^ auVar44;
              uVar21 = movmskps((int)p_Var24,auVar33);
              pRVar25 = (RayHitK<4> *)(ulong)(uVar21 ^ 0xf);
              context = local_198;
              fVar76 = local_148;
              fVar81 = fStack_144;
              fVar82 = fStack_140;
              fVar83 = fStack_13c;
              if ((uVar21 ^ 0xf) != 0) {
                fVar57 = *(float *)(local_188.hit + 4);
                fVar51 = *(float *)(local_188.hit + 8);
                fVar62 = *(float *)(local_188.hit + 0xc);
                *(uint *)(local_188.ray + 0xc0) =
                     ~auVar33._0_4_ & (uint)*(float *)local_188.hit |
                     *(uint *)(local_188.ray + 0xc0) & auVar33._0_4_;
                *(uint *)(local_188.ray + 0xc4) =
                     ~auVar33._4_4_ & (uint)fVar57 | *(uint *)(local_188.ray + 0xc4) & auVar33._4_4_
                ;
                *(uint *)(local_188.ray + 200) =
                     ~auVar33._8_4_ & (uint)fVar51 | *(uint *)(local_188.ray + 200) & auVar33._8_4_;
                *(uint *)(local_188.ray + 0xcc) =
                     ~auVar33._12_4_ & (uint)fVar62 |
                     *(uint *)(local_188.ray + 0xcc) & auVar33._12_4_;
                fVar57 = *(float *)(local_188.hit + 0x14);
                fVar51 = *(float *)(local_188.hit + 0x18);
                fVar62 = *(float *)(local_188.hit + 0x1c);
                *(uint *)(local_188.ray + 0xd0) =
                     ~auVar33._0_4_ & (uint)*(float *)(local_188.hit + 0x10) |
                     *(uint *)(local_188.ray + 0xd0) & auVar33._0_4_;
                *(uint *)(local_188.ray + 0xd4) =
                     ~auVar33._4_4_ & (uint)fVar57 | *(uint *)(local_188.ray + 0xd4) & auVar33._4_4_
                ;
                *(uint *)(local_188.ray + 0xd8) =
                     ~auVar33._8_4_ & (uint)fVar51 | *(uint *)(local_188.ray + 0xd8) & auVar33._8_4_
                ;
                *(uint *)(local_188.ray + 0xdc) =
                     ~auVar33._12_4_ & (uint)fVar62 |
                     *(uint *)(local_188.ray + 0xdc) & auVar33._12_4_;
                *(undefined1 (*) [16])(local_188.ray + 0xe0) =
                     ~auVar33 & *(undefined1 (*) [16])(local_188.hit + 0x20) |
                     *(undefined1 (*) [16])(local_188.ray + 0xe0) & auVar33;
                *(undefined1 (*) [16])(local_188.ray + 0xf0) =
                     ~auVar33 & *(undefined1 (*) [16])(local_188.hit + 0x30) |
                     *(undefined1 (*) [16])(local_188.ray + 0xf0) & auVar33;
                fVar57 = *(float *)(local_188.hit + 0x44);
                fVar51 = *(float *)(local_188.hit + 0x48);
                fVar62 = *(float *)(local_188.hit + 0x4c);
                *(uint *)(local_188.ray + 0x100) =
                     ~auVar33._0_4_ & (uint)*(float *)(local_188.hit + 0x40) |
                     *(uint *)(local_188.ray + 0x100) & auVar33._0_4_;
                *(uint *)(local_188.ray + 0x104) =
                     ~auVar33._4_4_ & (uint)fVar57 |
                     *(uint *)(local_188.ray + 0x104) & auVar33._4_4_;
                *(uint *)(local_188.ray + 0x108) =
                     ~auVar33._8_4_ & (uint)fVar51 |
                     *(uint *)(local_188.ray + 0x108) & auVar33._8_4_;
                *(uint *)(local_188.ray + 0x10c) =
                     ~auVar33._12_4_ & (uint)fVar62 |
                     *(uint *)(local_188.ray + 0x10c) & auVar33._12_4_;
                fVar57 = *(float *)(local_188.hit + 0x54);
                fVar51 = *(float *)(local_188.hit + 0x58);
                fVar62 = *(float *)(local_188.hit + 0x5c);
                *(uint *)(local_188.ray + 0x110) =
                     *(uint *)(local_188.ray + 0x110) & auVar33._0_4_ |
                     ~auVar33._0_4_ & (uint)*(float *)(local_188.hit + 0x50);
                *(uint *)(local_188.ray + 0x114) =
                     *(uint *)(local_188.ray + 0x114) & auVar33._4_4_ |
                     ~auVar33._4_4_ & (uint)fVar57;
                *(uint *)(local_188.ray + 0x118) =
                     *(uint *)(local_188.ray + 0x118) & auVar33._8_4_ |
                     ~auVar33._8_4_ & (uint)fVar51;
                *(uint *)(local_188.ray + 0x11c) =
                     *(uint *)(local_188.ray + 0x11c) & auVar33._12_4_ |
                     ~auVar33._12_4_ & (uint)fVar62;
                fVar57 = *(float *)(local_188.hit + 100);
                fVar51 = *(float *)(local_188.hit + 0x68);
                fVar62 = *(float *)(local_188.hit + 0x6c);
                *(uint *)(local_188.ray + 0x120) =
                     *(uint *)(local_188.ray + 0x120) & auVar33._0_4_ |
                     ~auVar33._0_4_ & (uint)*(float *)(local_188.hit + 0x60);
                *(uint *)(local_188.ray + 0x124) =
                     *(uint *)(local_188.ray + 0x124) & auVar33._4_4_ |
                     ~auVar33._4_4_ & (uint)fVar57;
                *(uint *)(local_188.ray + 0x128) =
                     *(uint *)(local_188.ray + 0x128) & auVar33._8_4_ |
                     ~auVar33._8_4_ & (uint)fVar51;
                *(uint *)(local_188.ray + 300) =
                     *(uint *)(local_188.ray + 300) & auVar33._12_4_ |
                     ~auVar33._12_4_ & (uint)fVar62;
                fVar57 = *(float *)(local_188.hit + 0x74);
                fVar51 = *(float *)(local_188.hit + 0x78);
                fVar62 = *(float *)(local_188.hit + 0x7c);
                *(uint *)(local_188.ray + 0x130) =
                     ~auVar33._0_4_ & (uint)*(float *)(local_188.hit + 0x70) |
                     *(uint *)(local_188.ray + 0x130) & auVar33._0_4_;
                *(uint *)(local_188.ray + 0x134) =
                     ~auVar33._4_4_ & (uint)fVar57 |
                     *(uint *)(local_188.ray + 0x134) & auVar33._4_4_;
                *(uint *)(local_188.ray + 0x138) =
                     ~auVar33._8_4_ & (uint)fVar51 |
                     *(uint *)(local_188.ray + 0x138) & auVar33._8_4_;
                *(uint *)(local_188.ray + 0x13c) =
                     ~auVar33._12_4_ & (uint)fVar62 |
                     *(uint *)(local_188.ray + 0x13c) & auVar33._12_4_;
                *(undefined1 (*) [16])(local_188.ray + 0x140) =
                     ~auVar33 & *(undefined1 (*) [16])(local_188.hit + 0x80) |
                     *(undefined1 (*) [16])(local_188.ray + 0x140) & auVar33;
                pRVar25 = (RayHitK<4> *)local_188.ray;
              }
            }
            auVar48._0_4_ = auVar44._0_4_ << 0x1f;
            auVar48._4_4_ = auVar44._4_4_ << 0x1f;
            auVar48._8_4_ = auVar44._8_4_ << 0x1f;
            auVar48._12_4_ = auVar44._12_4_ << 0x1f;
            iVar20 = movmskps((int)pRVar25,auVar48);
            uVar23 = CONCAT44((int)((ulong)pRVar25 >> 0x20),iVar20);
            if (iVar20 == 0) {
              *(float *)(ray + k * 4 + 0x80) = local_158;
              fVar75 = local_158;
              uVar78 = uStack_154;
              uVar79 = uStack_150;
              uVar80 = uStack_14c;
            }
            else {
              fVar75 = *(float *)(ray + k * 4 + 0x80);
              uVar78 = 0;
              uVar79 = 0;
              uVar80 = 0;
            }
            *(undefined4 *)(local_1b8 + lVar26 * 4) = 0;
            local_1b8._0_4_ = -(uint)(fVar76 <= fVar75) & local_1b8._0_4_;
            local_1b8._4_4_ = -(uint)(fVar81 <= fVar75) & local_1b8._4_4_;
            local_1b8._8_4_ = -(uint)(fVar82 <= fVar75) & local_1b8._8_4_;
            local_1b8._12_4_ = -(uint)(fVar83 <= fVar75) & local_1b8._12_4_;
          }
          iVar20 = movmskps((int)uVar23,local_1b8);
          if (iVar20 == 0) {
            return;
          }
          uVar21 = local_1b8._0_4_;
          uVar36 = local_1b8._4_4_;
          uVar38 = local_1b8._8_4_;
          uVar40 = local_1b8._12_4_;
          auVar45._0_4_ = uVar21 & (uint)fVar76;
          auVar45._4_4_ = uVar36 & (uint)fVar81;
          auVar45._8_4_ = uVar38 & (uint)fVar82;
          auVar45._12_4_ = uVar40 & (uint)fVar83;
          auVar54._0_8_ = CONCAT44(~uVar36,~uVar21) & 0x7f8000007f800000;
          auVar54._8_4_ = ~uVar38 & 0x7f800000;
          auVar54._12_4_ = ~uVar40 & 0x7f800000;
          auVar54 = auVar54 | auVar45;
          auVar59._4_4_ = auVar54._0_4_;
          auVar59._0_4_ = auVar54._4_4_;
          auVar59._8_4_ = auVar54._12_4_;
          auVar59._12_4_ = auVar54._8_4_;
          auVar77 = minps(auVar59,auVar54);
          auVar46._0_8_ = auVar77._8_8_;
          auVar46._8_4_ = auVar77._0_4_;
          auVar46._12_4_ = auVar77._4_4_;
          auVar77 = minps(auVar46,auVar77);
          auVar47._0_8_ =
               CONCAT44(-(uint)(auVar77._4_4_ == auVar54._4_4_) & uVar36,
                        -(uint)(auVar77._0_4_ == auVar54._0_4_) & uVar21);
          auVar47._8_4_ = -(uint)(auVar77._8_4_ == auVar54._8_4_) & uVar38;
          auVar47._12_4_ = -(uint)(auVar77._12_4_ == auVar54._12_4_) & uVar40;
          iVar20 = movmskps(iVar20,auVar47);
          auVar34 = local_1b8;
          if (iVar20 != 0) {
            auVar34._8_4_ = auVar47._8_4_;
            auVar34._0_8_ = auVar47._0_8_;
            auVar34._12_4_ = auVar47._12_4_;
          }
          uVar22 = movmskps(iVar20,auVar34);
          uVar23 = CONCAT44((int)(uVar23 >> 0x20),uVar22);
          lVar26 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }